

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

void __thiscall acto::core::worker_t::execute(worker_t *this)

{
  bool bVar1;
  worker_t *in_RSI;
  worker_t *this_local;
  
  while( true ) {
    event::wait(&this->wakeup_event_,in_RSI);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->active_);
    if (!bVar1) break;
    bVar1 = process(this);
    if (!bVar1) {
      in_RSI = this;
      (*this->slots_->_vptr_callbacks[4])();
    }
  }
  return;
}

Assistant:

void worker_t::execute() {
  while (true) {
    wakeup_event_.wait(); // Cond: (object_ != 0) || (active_ == false)
    if (!active_) {
      return;
    }
    if (!process()) {
      slots_->push_idle(this);
    }
  }
}